

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.hpp
# Opt level: O1

void __thiscall tokenizer::tokenizer(tokenizer *this,string *input)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar2 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + input->_M_string_length);
  p_Var1 = &(this->name)._M_t._M_impl.super__Rb_tree_header;
  (this->name)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->name)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  load_token_name_id(this);
  return;
}

Assistant:

tokenizer(const string &input): text(input) {
        load_token_name_id();
    }